

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateStructors
          (MessageGenerator *this,Printer *printer)

{
  Options *options;
  FieldDescriptor FVar1;
  pointer ppFVar2;
  FieldDescriptor *pFVar3;
  long lVar4;
  bool bVar5;
  OneofDescriptor *pOVar6;
  FieldGenerator *pFVar7;
  Options *in_RCX;
  long lVar8;
  FieldDescriptor *field;
  int i;
  ulong __n;
  pointer ppFVar9;
  reference rVar10;
  Formatter format;
  Iterator __begin5;
  string local_178;
  string initializer_null;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  Iterator __begin4;
  string initializer_with_arena;
  vector<bool,_std::allocator<bool>_> processed;
  Iterator __end5;
  Iterator __end4;
  string superclass;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  format.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
  superclass._M_dataplus._M_p = (pointer)&superclass.field_2;
  superclass._M_string_length = 0;
  superclass.field_2._M_local_buf[0] = '\0';
  options = &this->options_;
  SuperClassName_abi_cxx11_((string *)&vars,(cpp *)this->descriptor_,(Descriptor *)options,in_RCX);
  std::__cxx11::string::operator=((string *)&superclass,(string *)&vars);
  std::__cxx11::string::~string((string *)&vars);
  std::operator+(&initializer_with_arena,&superclass,"(arena, is_message_owned)");
  if (0 < *(int *)(this->descriptor_ + 0x78)) {
    std::__cxx11::string::append((char *)&initializer_with_arena);
  }
  ppFVar9 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppFVar2 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppFVar9 == ppFVar2) {
      bVar5 = IsAnyMessage(this->descriptor_,options);
      if (bVar5) {
        std::__cxx11::string::append((char *)&initializer_with_arena);
      }
      if (0 < this->num_weak_fields_) {
        std::__cxx11::string::append((char *)&initializer_with_arena);
      }
      std::operator+(&initializer_null,&superclass,"()");
      bVar5 = IsAnyMessage(this->descriptor_,options);
      if (bVar5) {
        std::__cxx11::string::append((char *)&initializer_null);
      }
      if (0 < this->num_weak_fields_) {
        std::__cxx11::string::append((char *)&initializer_null);
      }
      Formatter::operator()
                (&format,
                 "$classname$::$classname$(::$proto_ns$::Arena* arena,\n                         bool is_message_owned)\n  : $1$ {\n"
                 ,&initializer_with_arena);
      if ((this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        Formatter::operator()<>(&format,"  if (arena != nullptr) {\n");
        for (vars._M_t._M_impl._0_8_ = 0;
            (ulong)vars._M_t._M_impl._0_8_ <
            (ulong)(long)((this->max_inlined_string_index_ + 0x1f) / 0x20);
            vars._M_t._M_impl._0_8_ = vars._M_t._M_impl._0_8_ + 1) {
          Formatter::operator()
                    (&format,"    _inlined_string_donated_[$1$] = ~0u;\n",(unsigned_long *)&vars);
        }
        Formatter::operator()<>(&format,"  }\n");
      }
      bVar5 = HasSimpleBaseClass(this->descriptor_,options);
      if (!bVar5) {
        Formatter::operator()<>
                  (&format,
                   "  SharedCtor();\n  if (!is_message_owned) {\n    RegisterArenaDtor(arena);\n  }\n"
                  );
      }
      Formatter::operator()<>
                (&format,"  // @@protoc_insertion_point(arena_constructor:$full_name$)\n}\n");
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &vars._M_t._M_impl.super__Rb_tree_header._M_header;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      SetUnknownFieldsVariable(this->descriptor_,options,&vars);
      Formatter::AddMap(&format,&vars);
      bVar5 = UsingImplicitWeakFields(*(FileDescriptor **)(this->descriptor_ + 0x10),options);
      if (bVar5) {
        Formatter::operator()<>
                  (&format,
                   "$classname$::$classname$(const $classname$& from)\n  : $classname$() {\n  MergeFrom(from);\n}\n"
                  );
      }
      else {
        Formatter::operator()<>
                  (&format,"$classname$::$classname$(const $classname$& from)\n  : $superclass$()");
        io::Printer::Indent(format.printer_);
        io::Printer::Indent(format.printer_);
        io::Printer::Indent(format.printer_);
        if ((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          Formatter::operator()<>(&format,",\n_has_bits_(from._has_bits_)");
        }
        local_178._M_dataplus._M_p._0_1_ = 0;
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&processed,
                   (long)(this->optimized_order_).
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->optimized_order_).
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)&local_178,
                   (allocator_type *)&__begin4);
        for (__n = 0; ppFVar9 = (this->optimized_order_).
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
            __n < (ulong)((long)(this->optimized_order_).
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar9 >> 3);
            __n = __n + 1) {
          pFVar3 = ppFVar9[__n];
          if ((((~(byte)pFVar3[1] & 0x60) == 0) && (bVar5 = FieldDescriptor::is_map(pFVar3), !bVar5)
              ) || (bVar5 = IsCord(pFVar3,options), bVar5)) {
            rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&processed,__n);
            *rVar10._M_p = *rVar10._M_p | (ulong)rVar10._M_mask;
            FieldName_abi_cxx11_(&local_178,(cpp *)pFVar3,(FieldDescriptor *)rVar10._M_mask);
            Formatter::operator()(&format,",\n$1$_(from.$1$_)",&local_178);
            std::__cxx11::string::~string((string *)&local_178);
          }
        }
        bVar5 = IsAnyMessage(this->descriptor_,options);
        if (bVar5) {
          Formatter::operator()<>(&format,",\n_any_metadata_(&type_url_, &value_)");
        }
        if (0 < this->num_weak_fields_) {
          Formatter::operator()<>(&format,",\n_weak_field_map_(from._weak_field_map_)");
        }
        io::Printer::Outdent(format.printer_);
        io::Printer::Outdent(format.printer_);
        Formatter::operator()<>(&format," {\n");
        Formatter::operator()<>
                  (&format,
                   "_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_metadata_);\n"
                  );
        if (0 < *(int *)(this->descriptor_ + 0x78)) {
          Formatter::operator()<>
                    (&format,
                     "_extensions_.MergeFrom(internal_default_instance(), from._extensions_);\n");
        }
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)&local_58,&processed);
        GenerateConstructorBody(this,printer,(vector<bool,_std::allocator<bool>_> *)&local_58,true);
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
        __begin4.descriptor = this->descriptor_;
        __begin4.idx = 0;
        __end4.idx = *(int *)(__begin4.descriptor + 0x6c);
        __end4.descriptor = __begin4.descriptor;
        while (bVar5 = operator!=(&__begin4,&__end4), bVar5) {
          lVar8 = (long)__begin4.idx;
          lVar4 = *(long *)(__begin4.descriptor + 0x30);
          Formatter::operator()
                    (&format,"clear_has_$1$();\nswitch (from.$1$_case()) {\n",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (lVar4 + 8 + lVar8 * 0x28));
          io::Printer::Indent(format.printer_);
          pOVar6 = (OneofDescriptor *)(lVar4 + lVar8 * 0x28);
          __begin5.idx = 0;
          __end5.idx = *(int *)(pOVar6 + 4);
          __begin5.descriptor = pOVar6;
          __end5.descriptor = pOVar6;
          while (bVar5 = operator!=(&__begin5,&__end5), bVar5) {
            lVar8 = (long)__begin5.idx;
            lVar4 = *(long *)(__begin5.descriptor + 0x20);
            UnderscoresToCamelCase(&local_178,*(string **)(lVar4 + 8 + lVar8 * 0x48),true);
            Formatter::operator()(&format,"case k$1$: {\n",&local_178);
            std::__cxx11::string::~string((string *)&local_178);
            io::Printer::Indent(format.printer_);
            pFVar7 = FieldGeneratorMap::get
                               (&this->field_generators_,(FieldDescriptor *)(lVar4 + lVar8 * 0x48));
            (*pFVar7->_vptr_FieldGenerator[0xc])(pFVar7,printer);
            Formatter::operator()<>(&format,"break;\n");
            io::Printer::Outdent(format.printer_);
            Formatter::operator()<>(&format,"}\n");
            __begin5.idx = __begin5.idx + 1;
          }
          ToUpper(&local_178,*(string **)(pOVar6 + 8));
          Formatter::operator()(&format,"case $1$_NOT_SET: {\n  break;\n}\n",&local_178);
          std::__cxx11::string::~string((string *)&local_178);
          io::Printer::Outdent(format.printer_);
          Formatter::operator()<>(&format,"}\n");
          __begin4.idx = __begin4.idx + 1;
        }
        io::Printer::Outdent(format.printer_);
        Formatter::operator()<>
                  (&format,"  // @@protoc_insertion_point(copy_constructor:$full_name$)\n}\n\n");
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                  (&processed.super__Bvector_base<std::allocator<bool>_>);
      }
      GenerateSharedConstructorCode(this,printer);
      bVar5 = HasSimpleBaseClass(this->descriptor_,options);
      if (!bVar5) {
        Formatter::operator()<>
                  (&format,
                   "$classname$::~$classname$() {\n  // @@protoc_insertion_point(destructor:$full_name$)\n  if (GetArenaForAllocation() != nullptr) return;\n  SharedDtor();\n  _internal_metadata_.Delete<$unknown_fields_type$>();\n}\n\n"
                  );
      }
      GenerateSharedDestructorCode(this,printer);
      GenerateArenaDestructorCode(this,printer);
      bVar5 = HasSimpleBaseClass(this->descriptor_,options);
      if (!bVar5) {
        Formatter::operator()<>
                  (&format,
                   "void $classname$::SetCachedSize(int size) const {\n  _cached_size_.Set(size);\n}\n"
                  );
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&vars._M_t);
      std::__cxx11::string::~string((string *)&initializer_null);
      std::__cxx11::string::~string((string *)&initializer_with_arena);
      std::__cxx11::string::~string((string *)&superclass);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&format.vars_._M_t);
      return;
    }
    pFVar3 = *ppFVar9;
    FVar1 = pFVar3[1];
    pOVar6 = FieldDescriptor::real_containing_oneof(pFVar3);
    if (pOVar6 == (OneofDescriptor *)0x0) {
      bVar5 = IsLazy(pFVar3,options,this->scc_analyzer_);
      if ((bVar5) || (bVar5 = IsStringPiece(pFVar3,options), bVar5)) goto LAB_002d9ccf;
      bVar5 = IsString(pFVar3,options);
      if (!bVar5) goto LAB_002d9c94;
      bVar5 = IsStringInlined(pFVar3,options);
      if (((byte)FVar1 & 0x60) == 0x60 || bVar5) goto LAB_002d9ccf;
    }
    else {
LAB_002d9c94:
      if (((byte)FVar1 & 0x60) == 0x60) {
LAB_002d9ccf:
        std::__cxx11::string::string((string *)&initializer_null,",\n  ",(allocator *)&__end4);
        FieldName_abi_cxx11_(&local_178,(cpp *)pFVar3,field);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &processed,&initializer_null,&local_178);
        std::__cxx11::string::string((string *)&__begin4,"_(arena)",(allocator *)&__begin5);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &processed,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin4);
        std::__cxx11::string::append((string *)&initializer_with_arena);
        std::__cxx11::string::~string((string *)&vars);
        std::__cxx11::string::~string((string *)&__begin4);
        std::__cxx11::string::~string((string *)&processed);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&initializer_null);
      }
    }
    ppFVar9 = ppFVar9 + 1;
  } while( true );
}

Assistant:

void MessageGenerator::GenerateStructors(io::Printer* printer) {
  Formatter format(printer, variables_);

  std::string superclass;
  superclass = SuperClassName(descriptor_, options_);
  std::string initializer_with_arena = superclass + "(arena, is_message_owned)";

  if (descriptor_->extension_range_count() > 0) {
    initializer_with_arena += ",\n  _extensions_(arena)";
  }

  // Initialize member variables with arena constructor.
  for (auto field : optimized_order_) {
    GOOGLE_DCHECK(!IsFieldStripped(field, options_));
    bool has_arena_constructor = field->is_repeated();
    if (!field->real_containing_oneof() &&
        (IsLazy(field, options_, scc_analyzer_) ||
         IsStringPiece(field, options_) ||
         (IsString(field, options_) && IsStringInlined(field, options_)))) {
      has_arena_constructor = true;
    }
    if (has_arena_constructor) {
      initializer_with_arena +=
          std::string(",\n  ") + FieldName(field) + std::string("_(arena)");
    }
  }

  if (IsAnyMessage(descriptor_, options_)) {
    initializer_with_arena += ",\n  _any_metadata_(&type_url_, &value_)";
  }
  if (num_weak_fields_ > 0) {
    initializer_with_arena += ", _weak_field_map_(arena)";
  }

  std::string initializer_null = superclass + "()";
  if (IsAnyMessage(descriptor_, options_)) {
    initializer_null += ", _any_metadata_(&type_url_, &value_)";
  }
  if (num_weak_fields_ > 0) {
    initializer_null += ", _weak_field_map_(nullptr)";
  }

  format(
      "$classname$::$classname$(::$proto_ns$::Arena* arena,\n"
      "                         bool is_message_owned)\n"
      "  : $1$ {\n",
      initializer_with_arena);

  if (!inlined_string_indices_.empty()) {
    // Donate inline string fields.
    format("  if (arena != nullptr) {\n");
    for (size_t i = 0; i < InlinedStringDonatedSize(); ++i) {
      format("    _inlined_string_donated_[$1$] = ~0u;\n", i);
    }
    format("  }\n");
  }

  if (!HasSimpleBaseClass(descriptor_, options_)) {
    format(
        "  SharedCtor();\n"
        "  if (!is_message_owned) {\n"
        "    RegisterArenaDtor(arena);\n"
        "  }\n");
  }
  format(
      "  // @@protoc_insertion_point(arena_constructor:$full_name$)\n"
      "}\n");

  std::map<std::string, std::string> vars;
  SetUnknownFieldsVariable(descriptor_, options_, &vars);
  format.AddMap(vars);

  // Generate the copy constructor.
  if (UsingImplicitWeakFields(descriptor_->file(), options_)) {
    // If we are in lite mode and using implicit weak fields, we generate a
    // one-liner copy constructor that delegates to MergeFrom. This saves some
    // code size and also cuts down on the complexity of implicit weak fields.
    // We might eventually want to do this for all lite protos.
    format(
        "$classname$::$classname$(const $classname$& from)\n"
        "  : $classname$() {\n"
        "  MergeFrom(from);\n"
        "}\n");
  } else {
    format(
        "$classname$::$classname$(const $classname$& from)\n"
        "  : $superclass$()");
    format.Indent();
    format.Indent();
    format.Indent();

    // Do not copy inlined_string_donated_, because this is not an arena
    // constructor.

    if (!has_bit_indices_.empty()) {
      format(",\n_has_bits_(from._has_bits_)");
    }

    std::vector<bool> processed(optimized_order_.size(), false);
    for (int i = 0; i < optimized_order_.size(); i++) {
      auto field = optimized_order_[i];
      if (!(field->is_repeated() && !(field->is_map())) &&
          !IsCord(field, options_)) {
        continue;
      }

      processed[i] = true;
      format(",\n$1$_(from.$1$_)", FieldName(field));
    }

    if (IsAnyMessage(descriptor_, options_)) {
      format(",\n_any_metadata_(&type_url_, &value_)");
    }
    if (num_weak_fields_ > 0) {
      format(",\n_weak_field_map_(from._weak_field_map_)");
    }

    format.Outdent();
    format.Outdent();
    format(" {\n");

    format(
        "_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_"
        "metadata_);\n");

    if (descriptor_->extension_range_count() > 0) {
      format(
          "_extensions_.MergeFrom(internal_default_instance(), "
          "from._extensions_);\n");
    }

    GenerateConstructorBody(printer, processed, true);

    // Copy oneof fields. Oneof field requires oneof case check.
    for (auto oneof : OneOfRange(descriptor_)) {
      format(
          "clear_has_$1$();\n"
          "switch (from.$1$_case()) {\n",
          oneof->name());
      format.Indent();
      for (auto field : FieldRange(oneof)) {
        format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
        format.Indent();
        if (!IsFieldStripped(field, options_)) {
          field_generators_.get(field).GenerateMergingCode(printer);
        }
        format("break;\n");
        format.Outdent();
        format("}\n");
      }
      format(
          "case $1$_NOT_SET: {\n"
          "  break;\n"
          "}\n",
          ToUpper(oneof->name()));
      format.Outdent();
      format("}\n");
    }

    format.Outdent();
    format(
        "  // @@protoc_insertion_point(copy_constructor:$full_name$)\n"
        "}\n"
        "\n");
  }

  // Generate the shared constructor code.
  GenerateSharedConstructorCode(printer);

  // Generate the destructor.
  if (!HasSimpleBaseClass(descriptor_, options_)) {
    format(
        "$classname$::~$classname$() {\n"
        "  // @@protoc_insertion_point(destructor:$full_name$)\n"
        "  if (GetArenaForAllocation() != nullptr) return;\n"
        "  SharedDtor();\n"
        "  _internal_metadata_.Delete<$unknown_fields_type$>();\n"
        "}\n"
        "\n");
  } else {
    // For messages using simple base classes, having no destructor
    // allows our vtable to share the same destructor as every other
    // message with a simple base class.  This works only as long as
    // we have no fields needing destruction, of course.  (No strings
    // or extensions)
  }

  // Generate the shared destructor code.
  GenerateSharedDestructorCode(printer);

  // Generate the arena-specific destructor code.
  GenerateArenaDestructorCode(printer);

  if (!HasSimpleBaseClass(descriptor_, options_)) {
    // Generate SetCachedSize.
    format(
        "void $classname$::SetCachedSize(int size) const {\n"
        "  _cached_size_.Set(size);\n"
        "}\n");
  }
}